

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

bool Am_Active_If_Selection_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *list_value;
  Am_Object sel_widget;
  Am_Value_List selection;
  Am_Object AStack_38;
  Am_Value_List local_30;
  Am_Object local_20;
  
  Am_Object::Am_Object(&local_20,self);
  Am_Get_Selection_Widget_For_Command(&AStack_38);
  Am_Object::~Am_Object(&local_20);
  list_value = Am_Object::Get(&AStack_38,0x169,0);
  Am_Value_List::Am_Value_List(&local_30,list_value);
  bVar1 = Am_Value_List::Empty(&local_30);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = Am_Check_All_Objects_For_Inactive_Slot(&local_30,self);
  }
  Am_Value_List::~Am_Value_List(&local_30);
  Am_Object::~Am_Object(&AStack_38);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, Am_Active_If_Selection)
{
  Am_Object sel_widget = Am_Get_Selection_Widget_For_Command(self);
  Am_Value_List selection = sel_widget.Get(Am_VALUE);
  if (!selection.Empty()) {
    return Am_Check_All_Objects_For_Inactive_Slot(selection, self);
  } else
    return false;
}